

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::pack_alpha_endpoints
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_short *puVar5;
  vector<unsigned_char> *other;
  uint local_178;
  uint sym_1;
  uint i_1;
  symbol_codec codec;
  static_huffman_data_model residual_dm;
  int sym;
  int delta;
  uint j;
  uint cur [2];
  uint endpoint;
  uint endpoint_index;
  int total_residuals;
  uint prev [2];
  vector<unsigned_int> residual_syms;
  symbol_histogram hist;
  uint local_3c;
  undefined1 local_38 [4];
  uint i;
  vector<unsigned_int> remapped_endpoints;
  vector<unsigned_short> *remapping_local;
  vector<unsigned_char> *packed_data_local;
  crn_comp *this_local;
  
  remapped_endpoints._8_8_ = remapping;
  uVar1 = vector<unsigned_int>::size(&this->m_alpha_endpoints);
  vector<unsigned_int>::vector((vector<unsigned_int> *)local_38,uVar1);
  local_3c = 0;
  while( true ) {
    uVar1 = vector<unsigned_int>::size(&this->m_alpha_endpoints);
    if (uVar1 <= local_3c) break;
    puVar4 = vector<unsigned_int>::operator[](&this->m_alpha_endpoints,local_3c);
    uVar3 = *puVar4;
    puVar5 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)remapped_endpoints._8_8_,local_3c);
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_38,(uint)*puVar5);
    *puVar4 = uVar3;
    local_3c = local_3c + 1;
  }
  symbol_histogram::symbol_histogram((symbol_histogram *)&residual_syms.m_size,0);
  symbol_histogram::resize((symbol_histogram *)&residual_syms.m_size,0x100);
  vector<unsigned_int>::vector((vector<unsigned_int> *)prev);
  uVar1 = vector<unsigned_int>::size(&this->m_alpha_endpoints);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)prev,uVar1 * 6);
  utils::zero_object<unsigned_int[2]>((uint (*) [2])&endpoint_index);
  cur[1] = 0;
  while( true ) {
    uVar1 = cur[1];
    uVar2 = vector<unsigned_int>::size(&this->m_alpha_endpoints);
    if (uVar2 <= uVar1) break;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_38,cur[1]);
    cur[0] = *puVar4;
    delta = dxt5_block::unpack_endpoint(cur[0],0);
    j = dxt5_block::unpack_endpoint(cur[0],1);
    for (sym = 0; (uint)sym < 2; sym = sym + 1) {
      uVar3 = (&delta)[(uint)sym] - (&endpoint_index)[(uint)sym] & 0xff;
      symbol_histogram::inc_freq((symbol_histogram *)&residual_syms.m_size,uVar3,1);
      residual_dm._52_4_ = uVar3;
      vector<unsigned_int>::push_back((vector<unsigned_int> *)prev,(uint *)&residual_dm.field_0x34);
    }
    endpoint_index = delta;
    total_residuals = j;
    cur[1] = cur[1] + 1;
  }
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)&codec.m_support_arith);
  symbol_codec::symbol_codec((symbol_codec *)&i_1);
  symbol_codec::start_encoding((symbol_codec *)&i_1,0x100000);
  uVar3 = static_huffman_data_model::init
                    ((static_huffman_data_model *)&codec.m_support_arith,(EVP_PKEY_CTX *)0x1);
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = symbol_codec::encode_transmit_static_huffman_data_model
                      ((symbol_codec *)&i_1,(static_huffman_data_model *)&codec.m_support_arith,
                       false,(static_huffman_data_model *)0x0);
    if (uVar1 == 0) {
      this_local._7_1_ = false;
    }
    else {
      local_178 = 0;
      while( true ) {
        uVar1 = vector<unsigned_int>::size((vector<unsigned_int> *)prev);
        if (uVar1 <= local_178) break;
        puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)prev,local_178);
        symbol_codec::encode
                  ((symbol_codec *)&i_1,*puVar4,(static_huffman_data_model *)&codec.m_support_arith)
        ;
        local_178 = local_178 + 1;
      }
      symbol_codec::stop_encoding((symbol_codec *)&i_1,false);
      other = symbol_codec::get_encoding_buf((symbol_codec *)&i_1);
      vector<unsigned_char>::swap(packed_data,other);
      this_local._7_1_ = true;
    }
  }
  symbol_codec::~symbol_codec((symbol_codec *)&i_1);
  static_huffman_data_model::~static_huffman_data_model
            ((static_huffman_data_model *)&codec.m_support_arith);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)prev);
  symbol_histogram::~symbol_histogram((symbol_histogram *)&residual_syms.m_size);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)local_38);
  return this_local._7_1_;
}

Assistant:

bool crn_comp::pack_alpha_endpoints(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint> remapped_endpoints(m_alpha_endpoints.size());

        for (uint i = 0; i < m_alpha_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = m_alpha_endpoints[i];
        }

        symbol_histogram hist;
        hist.resize(256);

        crnlib::vector<uint> residual_syms;
        residual_syms.reserve(m_alpha_endpoints.size() * 2 * 3);

        uint prev[2];
        utils::zero_object(prev);

        int total_residuals = 0;

        for (uint endpoint_index = 0; endpoint_index < m_alpha_endpoints.size(); endpoint_index++)
        {
            const uint endpoint = remapped_endpoints[endpoint_index];

            uint cur[2];
            cur[0] = dxt5_block::unpack_endpoint(endpoint, 0);
            cur[1] = dxt5_block::unpack_endpoint(endpoint, 1);

            for (uint j = 0; j < 2; j++)
            {
                int delta = cur[j] - prev[j];
                total_residuals += delta * delta;

                int sym = delta & 255;

                hist.inc_freq(sym);

                residual_syms.push_back(sym);
            }

            prev[0] = cur[0];
            prev[1] = cur[1];
        }

        static_huffman_data_model residual_dm;

        symbol_codec codec;
        codec.start_encoding(1024 * 1024);

        // Transmit residuals
        if (!residual_dm.init(true, hist, 15))
        {
            return false;
        }

        if (!codec.encode_transmit_static_huffman_data_model(residual_dm, false))
        {
            return false;
        }

        for (uint i = 0; i < residual_syms.size(); i++)
        {
            const uint sym = residual_syms[i];
            codec.encode(sym, residual_dm);
        }

        codec.stop_encoding(false);

        packed_data.swap(codec.get_encoding_buf());

        return true;
    }